

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Maybe<kj::AutoCloseFd>_> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>(AsyncStreamFd *this)

{
  _func_int **pp_Var1;
  PromiseNode *pPVar2;
  int iVar3;
  ssize_t sVar4;
  TransformPromiseNodeBase *pTVar5;
  ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_> *pIVar6;
  ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_> *extraout_RDX_01;
  _func_int **in_RSI;
  AutoCloseFd *this_00;
  Own<kj::_::ChainPromiseNode> OVar7;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_>_> OVar8;
  Promise<kj::Maybe<kj::AutoCloseFd>_> PVar9;
  Fault f;
  char c;
  Fault f_1;
  anon_union_24_2_c6a5a82d anon_var_2;
  iovec iov;
  msghdr msg;
  undefined1 local_e0 [8];
  TransformPromiseNodeBase *local_d8;
  undefined1 local_c9;
  Fault local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  PromiseNode *local_b0;
  undefined1 local_a8 [12];
  Maybe<kj::AutoCloseFd> local_9c;
  PromiseFulfiller<void> *local_90;
  int local_88;
  int local_84;
  int local_80;
  iovec local_78;
  msghdr local_68;
  
  local_68.msg_name = (void *)0x0;
  local_68.msg_namelen = 0;
  local_68._12_4_ = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  local_68.msg_iov = &local_78;
  local_78.iov_base = &local_c9;
  local_78.iov_len = 1;
  local_68.msg_iovlen = 1;
  local_68.msg_control = &local_90;
  local_68.msg_controllen = 0x18;
  do {
    sVar4 = recvmsg(*(int *)(in_RSI + 2),&local_68,0x40000000);
    if (-1 < sVar4) {
      iVar3 = 0;
      break;
    }
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_e0._0_4_ = 0;
    local_e0._4_4_ = 0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = (_func_int **)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_e0);
  }
  if (sVar4 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_b8);
    pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(Own<kj::_::PromiseNode> *)local_b8,
               kj::_::
               TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:467:50),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00650eb8;
    pTVar5[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    local_e0 = (undefined1  [8])
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>()::{lambda()#2},kj::_::PropagateException>>
                ::instance;
    local_d8 = pTVar5;
    OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                      ((kj *)&local_c8,(Own<kj::_::PromiseNode> *)local_e0);
    pTVar5 = local_d8;
    pIVar6 = (ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_> *)OVar7.ptr;
    *(undefined4 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = local_c8.exception._0_4_;
    *(undefined4 *)
     ((long)&(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
             _vptr_AsyncInputStream + 4) = local_c8.exception._4_4_;
    *(undefined4 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (undefined4)uStack_c0;
    *(undefined4 *)
     ((long)&(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
             _vptr_AsyncOutputStream + 4) = uStack_c0._4_4_;
    if (local_d8 != (TransformPromiseNodeBase *)0x0) {
      local_d8 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_e0)
                (local_e0,(pTVar5->super_PromiseNode)._vptr_PromiseNode[-2] +
                          (long)&(pTVar5->super_PromiseNode)._vptr_PromiseNode);
      pIVar6 = extraout_RDX;
    }
    pPVar2 = local_b0;
    if (local_b0 != (PromiseNode *)0x0) {
      local_b0 = (PromiseNode *)0x0;
      (**((EventPort *)local_b8)->_vptr_EventPort)
                (local_b8,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      pIVar6 = extraout_RDX_00;
    }
  }
  else {
    if (sVar4 == 0) {
      local_9c.ptr.isSet = false;
      OVar8 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>>,kj::Maybe<kj::AutoCloseFd>>
                        ((kj *)&local_c8,&local_9c);
      pp_Var1 = uStack_c0;
      pIVar6 = OVar8.ptr;
      uStack_c0 = (_func_int **)0x0;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)local_c8.exception;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = pp_Var1;
      if (local_9c.ptr.isSet != true) goto LAB_0048f440;
      this_00 = (AutoCloseFd *)&local_9c.ptr.field_1;
    }
    else {
      if (local_68.msg_controllen < 0x10) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                  (&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1da,FAILED,"msg.msg_controllen >= sizeof(cmsg)",
                   "\"expected to receive FD over socket; received data instead\"",
                   (char (*) [58])"expected to receive FD over socket; received data instead");
        kj::_::Debug::Fault::fatal(&local_c8);
      }
      if (local_88 != 1) {
        local_e0._0_4_ = 0;
        local_e0._4_4_ = 0;
        local_c8.exception = (Exception *)0x0;
        uStack_c0 = (_func_int **)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)local_e0,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)local_e0);
      }
      if (local_84 != 1) {
        local_e0._0_4_ = 0;
        local_e0._4_4_ = 0;
        local_c8.exception = (Exception *)0x0;
        uStack_c0 = (_func_int **)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)local_e0,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)local_e0);
      }
      if (local_90 != (PromiseFulfiller<void> *)0x14) {
        local_e0._0_4_ = 0;
        local_e0._4_4_ = 0;
        local_c8.exception = (Exception *)0x0;
        uStack_c0 = (_func_int **)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)local_e0,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)local_e0);
      }
      local_e0._0_4_ = local_80;
      UnwindDetector::UnwindDetector((UnwindDetector *)(local_e0 + 4));
      local_a8[0] = true;
      local_a8._4_4_ = local_e0._0_4_;
      UnwindDetector::UnwindDetector((UnwindDetector *)(local_a8 + 8));
      local_e0._0_4_ = -1;
      heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>>,kj::Maybe<kj::AutoCloseFd>>
                ((kj *)&local_c8,(Maybe<kj::AutoCloseFd> *)local_a8);
      pp_Var1 = uStack_c0;
      uStack_c0 = (_func_int **)0x0;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)local_c8.exception;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = pp_Var1;
      if (local_a8[0] == true) {
        AutoCloseFd::~AutoCloseFd((AutoCloseFd *)(local_a8 + 4));
      }
      this_00 = (AutoCloseFd *)local_e0;
    }
    AutoCloseFd::~AutoCloseFd(this_00);
    pIVar6 = extraout_RDX_01;
  }
LAB_0048f440:
  PVar9.super_PromiseBase.node.ptr = (PromiseNode *)pIVar6;
  PVar9.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::AutoCloseFd>_>)PVar9.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }